

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

VkBool32 BreakCallback(VkFlags msgFlags,VkDebugReportObjectTypeEXT objType,uint64_t srcObject,
                      size_t location,int32_t msgCode,char *pLayerPrefix,char *pMsg,void *pUserData)

{
  char *pLayerPrefix_local;
  int32_t msgCode_local;
  size_t location_local;
  uint64_t srcObject_local;
  VkDebugReportObjectTypeEXT objType_local;
  VkFlags msgFlags_local;
  
  raise(5);
  return 0;
}

Assistant:

VKAPI_CALL
BreakCallback(VkFlags msgFlags, VkDebugReportObjectTypeEXT objType,
              uint64_t srcObject, size_t location, int32_t msgCode,
              const char *pLayerPrefix, const char *pMsg,
              void *pUserData) {
#ifdef _WIN32
    DebugBreak();
#else
    raise(SIGTRAP);
#endif

    return false;
}